

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O1

int __thiscall
vkt::shaderexecutor::ShaderIntegerFunctionTests::init
          (ShaderIntegerFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int iVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  long lVar5;
  int iVar6;
  int shaderTypeNdx;
  ShaderType SVar7;
  int prec;
  Precision PVar8;
  int iVar9;
  bool bVar10;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "uaddcarry","uaddcarry");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    if (lVar5 != 0) {
      iVar2 = (&DAT_00b592b8)[lVar5];
      iVar6 = 1;
      do {
        PVar8 = PRECISION_MEDIUMP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar4 = (TestNode *)operator_new(0xf0);
            UaddCarryCase::UaddCarryCase
                      ((UaddCarryCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                       iVar2 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "usubborrow","usubborrow");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    if (lVar5 != 0) {
      iVar2 = (&DAT_00b592b8)[lVar5];
      iVar6 = 1;
      do {
        PVar8 = PRECISION_MEDIUMP;
        do {
          SVar7 = SHADERTYPE_VERTEX;
          do {
            pTVar4 = (TestNode *)operator_new(0xf0);
            UsubBorrowCase::UsubBorrowCase
                      ((UsubBorrowCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                       ,iVar2 + -1 + iVar6,PVar8,SVar7);
            tcu::TestNode::addChild(pTVar3,pTVar4);
            SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
          } while (SVar7 != SHADERTYPE_LAST);
          PVar8 = PVar8 + PRECISION_MEDIUMP;
        } while (PVar8 != PRECISION_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "umulextended","umulextended");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    if (lVar5 != 0) {
      iVar2 = (&DAT_00b592b8)[lVar5];
      iVar6 = 1;
      do {
        iVar9 = 1;
        do {
          if (iVar9 == 2) {
            SVar7 = SHADERTYPE_VERTEX;
            do {
              pTVar4 = (TestNode *)operator_new(0xf0);
              UmulExtendedCase::UmulExtendedCase
                        ((UmulExtendedCase *)pTVar4,
                         (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar6,
                         PRECISION_HIGHP,SVar7);
              tcu::TestNode::addChild(pTVar3,pTVar4);
              SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
            } while (SVar7 != SHADERTYPE_LAST);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != 3);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "imulextended","imulextended");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    if (lVar5 != 1) {
      iVar2 = (&DAT_00b592b8)[lVar5];
      iVar6 = 1;
      do {
        iVar9 = 1;
        do {
          if (iVar9 == 2) {
            SVar7 = SHADERTYPE_VERTEX;
            do {
              pTVar4 = (TestNode *)operator_new(0xf0);
              ImulExtendedCase::ImulExtendedCase
                        ((ImulExtendedCase *)pTVar4,
                         (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar6,
                         PRECISION_HIGHP,SVar7);
              tcu::TestNode::addChild(pTVar3,pTVar4);
              SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
            } while (SVar7 != SHADERTYPE_LAST);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != 3);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 5);
    }
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldextract","bitfieldextract");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldExtractCase::BitfieldExtractCase
                    ((BitfieldExtractCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar6,PVar8,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldinsert","bitfieldinsert");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldInsertCase::BitfieldInsertCase
                    ((BitfieldInsertCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar6,PVar8,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldreverse","bitfieldreverse");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldReverseCase::BitfieldReverseCase
                    ((BitfieldReverseCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar6,PVar8,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"bitcount"
             ,"bitcount");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitCountCase::BitCountCase
                    ((BitCountCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar6,PVar8,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"findlsb",
             "findlsb");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          FindLSBCase::FindLSBCase
                    ((FindLSBCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar6,PVar8,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    bVar10 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar10);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"findMSB",
             "findMSB");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  do {
    iVar2 = (&DAT_00b592b8)[lVar5];
    iVar6 = 1;
    do {
      PVar8 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          findMSBCase::findMSBCase
                    ((findMSBCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar6,PVar8,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar8 = PVar8 + PRECISION_MEDIUMP;
      } while (PVar8 != PRECISION_LAST);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 5);
    lVar1 = lVar5 + 1;
    bVar10 = lVar5 == 0;
    lVar5 = lVar1;
  } while (bVar10);
  return (int)lVar1;
}

Assistant:

void ShaderIntegerFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS
	};

	//																		Int?	Uint?	AllPrec?	Shaders
	addFunctionCases<UaddCarryCase>				(this,	"uaddcarry",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UsubBorrowCase>			(this,	"usubborrow",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UmulExtendedCase>			(this,	"umulextended",		false,	true,	false,		ALL_SHADERS);
	addFunctionCases<ImulExtendedCase>			(this,	"imulextended",		true,	false,	false,		ALL_SHADERS);
	addFunctionCases<BitfieldExtractCase>		(this,	"bitfieldextract",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldInsertCase>		(this,	"bitfieldinsert",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldReverseCase>		(this,	"bitfieldreverse",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitCountCase>				(this,	"bitcount",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindLSBCase>				(this,	"findlsb",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<findMSBCase>				(this,	"findMSB",			true,	true,	true,		ALL_SHADERS);
}